

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesShaft::Compute_inc_Mb_v
          (ChVariablesShaft *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  lVar2 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar3 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar2 != iVar3) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesShaft.cpp"
                  ,0x3f,
                  "virtual void chrono::ChVariablesShaft::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar2 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar3 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
  if (lVar2 != iVar3) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesShaft.cpp"
                  ,0x40,
                  "virtual void chrono::ChVariablesShaft::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  if ((vect->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value < 1) {
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  if (0 < *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->m_inertia;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(vect->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                    .m_data;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = **(ulong **)
                     &result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    auVar1 = vfmadd213sd_fma(auVar5,auVar4,auVar1);
    **(ulong **)
      &result->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
         = auVar1._0_8_;
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChVariablesShaft::Compute_inc_Mb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == Get_ndof());
    assert(vect.size() == Get_ndof());

    result(0) += m_inertia * vect(0);
}